

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1b575::CpuTest_nop64_zero_Test::TestBody(CpuTest_nop64_zero_Test *this)

{
  CpuRegisters *pCVar1;
  undefined2 uVar2;
  TypedExpectation<unsigned_char_(unsigned_short)> *this_00;
  char *message;
  MatcherBase<unsigned_short> local_80;
  ReturnAction<int> local_68;
  _Any_data local_58 [2];
  AssertionResult gtest_ar;
  
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,'d');
  pCVar1 = &(this->super_CpuTest).expected;
  pCVar1->pc = pCVar1->pc + 1;
  uVar2 = (this->super_CpuTest).registers.pc;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_80,uVar2 + 1);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
             &(this->super_CpuTest).mmu.super_MockMmu,(Matcher<unsigned_short> *)&local_80);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                      ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                       ,0x256,"mmu","read_byte(registers.pc + 1)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_68,0xcd);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)local_58,(ReturnAction *)&local_68);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (this_00,(Action<unsigned_char_(unsigned_short)> *)local_58);
  std::_Function_base::~_Function_base((_Function_base *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_80);
  n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x03');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)&gtest_ar,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_58);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x259,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((long *)local_58[0]._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_58[0]._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(CpuTest, nop64_zero) {
    stage_instruction(NOP_ZERO64);
    expected.pc += 1;
    EXPECT_CALL(mmu, read_byte(registers.pc + 1)).WillOnce(Return(0xCD));

    step_execution(3);
    EXPECT_EQ(expected, registers);
}